

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall
kj::AsyncCapabilityStream::writeWithFds
          (AsyncCapabilityStream *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_kj::OwnFd> fds)

{
  OwnFd *ptr;
  size_t size;
  undefined8 in_R9;
  ArrayPtr<const_int> AVar1;
  int *local_48;
  ArrayPtr<const_int> intArray;
  AsyncCapabilityStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  ptr = ArrayPtr<const_kj::OwnFd>::begin(&fds);
  size = ArrayPtr<const_kj::OwnFd>::size(&fds);
  AVar1 = arrayPtr<int_const>(&ptr->fd,size);
  local_48 = AVar1.ptr;
  intArray.ptr = (int *)AVar1.size_;
  (**(code **)(*(long *)data.ptr + 0x70))
            (this,data.ptr,data.size_,moreData.ptr,moreData.size_,in_R9,local_48,intArray.ptr);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> AsyncCapabilityStream::writeWithFds(
    ArrayPtr<const byte> data, ArrayPtr<const ArrayPtr<const byte>> moreData,
    ArrayPtr<const OwnFd> fds) {
  // HACK: OwnFd actually contains an `int` under the hood. We can reinterpret_cast to avoid
  //   unnecessary memory allocation.
  static_assert(sizeof(OwnFd) == sizeof(int), "this optimization won't work");
  auto intArray = arrayPtr(reinterpret_cast<const int*>(fds.begin()), fds.size());

  // Be extra-paranoid about aliasing rules by injecting a compiler barrier here. Probably
  // not necessary but also probably doesn't hurt.
#if _MSC_VER
  _ReadWriteBarrier();
#else
  __asm__ __volatile__("": : :"memory");
#endif

  return writeWithFds(data, moreData, intArray);
}